

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_chronicle.cpp
# Opt level: O0

int64_t __thiscall cornelich::vanilla_chronicle::last_index(vanilla_chronicle *this)

{
  bool bVar1;
  element_type *region_00;
  int64_t iVar2;
  long local_70;
  int64_t index_entry_number;
  int64_t count_entries;
  undefined1 local_30 [8];
  region_ptr region;
  int32_t last_file;
  int32_t last_cycle;
  vanilla_chronicle *this_local;
  
  region.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       vanilla_index::find_last_cycle(&this->m_index);
  if (region.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ == -1) {
    this_local = (vanilla_chronicle *)0xffffffffffffffff;
  }
  else {
    region.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
         = vanilla_index::last_index_file_number
                     (&this->m_index,
                      region.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._4_4_,-1);
    if ((int32_t)region.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi == -1) {
      this_local = (vanilla_chronicle *)0xffffffffffffffff;
    }
    else {
      vanilla_index::index_for
                ((vanilla_index *)local_30,(int)this + 0xa0,
                 region.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._4_4_,
                 SUB41((int32_t)region.
                                super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi,0));
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
      if (bVar1) {
        region_00 = std::
                    __shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_30);
        iVar2 = vanilla_index::count_index_entries(region_00);
        if (iVar2 < 1) {
          local_70 = 0;
        }
        else {
          local_70 = iVar2 + -1;
        }
        this_local = (vanilla_chronicle *)
                     (((long)region.
                             super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._4_4_ <<
                      ((byte)this->m_entries_for_cycle_bits & 0x3f)) +
                      ((long)(int32_t)region.
                                      super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi <<
                      ((byte)this->m_index_block_size_bits & 0x3f)) + local_70);
      }
      else {
        this_local = (vanilla_chronicle *)0xffffffffffffffff;
      }
      std::shared_ptr<cornelich::region>::~shared_ptr((shared_ptr<cornelich::region> *)local_30);
    }
  }
  return (int64_t)this_local;
}

Assistant:

std::int64_t vanilla_chronicle::last_index()
{
    const auto last_cycle = m_index.find_last_cycle();
    if(last_cycle == -1)
        return -1;

    const auto last_file = m_index.last_index_file_number(last_cycle, -1);
    if(last_file == -1)
        return -1;

    const auto region = m_index.index_for(last_cycle, last_file, false);
    if(!region)
        return -1;
    const auto count_entries = vanilla_index::count_index_entries(*region);
    const auto index_entry_number = (count_entries > 0) ? count_entries - 1 : 0;

    return (static_cast<std::int64_t>(last_cycle) <<  m_entries_for_cycle_bits) +
           (static_cast<std::int64_t>(last_file) << m_index_block_size_bits) +
           index_entry_number;
}